

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PSound::WriteValue(PSound *this,FArchive *ar,void *addr)

{
  char *name;
  void *addr_local;
  FArchive *ar_local;
  PSound *this_local;
  
  FArchive::WriteByte(ar,'\r');
  name = FSoundID::operator_cast_to_char_((FSoundID *)addr);
  FArchive::WriteName(ar,name);
  return;
}

Assistant:

void PSound::WriteValue(FArchive &ar, const void *addr) const
{
	ar.WriteByte(VAL_Name);
	ar.WriteName(*(const FSoundID *)addr);
}